

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O1

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::resize
          (ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *this,size_t size)

{
  undefined8 *puVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  
  if (this->allocatedElements < size) {
    reallocate(this,size);
  }
  uVar2 = this->usedElements;
  lVar4 = size - uVar2;
  if (uVar2 <= size && lVar4 != 0) {
    lVar3 = uVar2 << 4;
    do {
      puVar1 = (undefined8 *)((long)&(this->data->super_IString).str._M_len + lVar3);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar3 = lVar3 + 0x10;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  this->usedElements = size;
  return;
}

Assistant:

void resize(size_t size) {
    if (size > allocatedElements) {
      reallocate(size);
    }
    // construct new elements
    for (size_t i = usedElements; i < size; i++) {
      new (data + i) T();
    }
    usedElements = size;
  }